

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void kahanBabuskaNeumaierStep(SumCtx *pSum,double r)

{
  double dVar1;
  double dVar2;
  double s;
  double r_local;
  double t;
  
  dVar2 = pSum->rSum;
  dVar1 = dVar2 + r;
  if (ABS(dVar2) <= ABS(r)) {
    dVar2 = (r - dVar1) + dVar2;
  }
  else {
    dVar2 = (dVar2 - dVar1) + r;
  }
  pSum->rErr = dVar2 + pSum->rErr;
  pSum->rSum = dVar1;
  return;
}

Assistant:

static void kahanBabuskaNeumaierStep(
  volatile SumCtx *pSum,
  volatile double r
){
  volatile double s = pSum->rSum;
  volatile double t = s + r;
  if( fabs(s) > fabs(r) ){
    pSum->rErr += (s - t) + r;
  }else{
    pSum->rErr += (r - t) + s;
  }
  pSum->rSum = t;
}